

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gtk.cxx
# Opt level: O0

void gtk_round_up_box(int x,int y,int w,int h,Fl_Color c)

{
  Fl_Color FVar1;
  Fl_Color c_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  gtk_color(c);
  draw(3,x,y,w,h,2);
  FVar1 = fl_color_average(0x38,c,0.025);
  gtk_color(FVar1);
  draw(1,x + 1,y,w + -2,h,2);
  draw(1,x,y,w,h,3);
  FVar1 = fl_color_average(0x38,c,0.05);
  gtk_color(FVar1);
  draw(1,x + 1,y,w + -2,h,1);
  draw(1,x,y,w,h,2);
  FVar1 = fl_color_average(0x38,c,0.1);
  gtk_color(FVar1);
  draw(1,x + 1,y,w + -2,h,0);
  draw(1,x,y,w,h,1);
  FVar1 = fl_color_average(0xff,c,0.1);
  gtk_color(FVar1);
  draw(0,x,y,w,h,4);
  draw(0,x + 1,y,w + -2,h,3);
  FVar1 = fl_color_average(0xff,c,0.2);
  gtk_color(FVar1);
  draw(0,x,y,w,h,3);
  draw(0,x + 1,y,w + -2,h,2);
  FVar1 = fl_color_average(0xff,c,0.4);
  gtk_color(FVar1);
  draw(0,x,y,w,h,2);
  draw(0,x + 1,y,w + -2,h,1);
  FVar1 = fl_color_average(0xff,c,0.5);
  gtk_color(FVar1);
  draw(0,x,y,w,h,1);
  draw(0,x + 1,y,w + -2,h,0);
  FVar1 = fl_color_average(0x38,c,0.5);
  gtk_color(FVar1);
  draw(2,x,y,w,h,0);
  return;
}

Assistant:

static void gtk_round_up_box(int x, int y, int w, int h, Fl_Color c) {
  gtk_color(c);
  draw(FILL,	    x,   y, w,   h, 2);

  gtk_color(fl_color_average(FL_BLACK, c, 0.025f));
  draw(LOWER_RIGHT, x+1, y, w-2, h, 2);
  draw(LOWER_RIGHT, x,   y, w,   h, 3);
  gtk_color(fl_color_average(FL_BLACK, c, 0.05f));
  draw(LOWER_RIGHT, x+1, y, w-2, h, 1);
  draw(LOWER_RIGHT, x,   y, w,   h, 2);
  gtk_color(fl_color_average(FL_BLACK, c, 0.1f));
  draw(LOWER_RIGHT, x+1, y, w-2, h, 0);
  draw(LOWER_RIGHT, x,   y, w,   h, 1);

  gtk_color(fl_color_average(FL_WHITE, c, 0.1f));
  draw(UPPER_LEFT,  x,   y, w,   h, 4);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 3);
  gtk_color(fl_color_average(FL_WHITE, c, 0.2f));
  draw(UPPER_LEFT,  x,   y, w,   h, 3);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 2);
  gtk_color(fl_color_average(FL_WHITE, c, 0.4f));
  draw(UPPER_LEFT,  x,   y, w,   h, 2);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 1);
  gtk_color(fl_color_average(FL_WHITE, c, 0.5f));
  draw(UPPER_LEFT,  x,   y, w,   h, 1);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 0);

  gtk_color(fl_color_average(FL_BLACK, c, 0.5f));
  draw(CLOSED,	    x,   y, w,   h, 0);
}